

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O0

lysc_node * lyd_parser_node_schema(lyd_node *node)

{
  uint32_t uVar1;
  lyd_node *plVar2;
  lys_module *module;
  bool local_59;
  lysc_ext_instance *local_58;
  lys_module *mod;
  lysc_node *schema;
  lyd_node *iter;
  uint32_t i;
  lyd_node *node_local;
  
  mod = (lys_module *)0x0;
  if (node == (lyd_node *)0x0) {
    node_local = (lyd_node *)0x0;
  }
  else if (node->schema == (lysc_node *)0x0) {
    uVar1 = ly_log_location_dnode_count();
    do {
      iter._4_4_ = uVar1;
      if (iter._4_4_ == 0) goto LAB_001a7ad5;
      uVar1 = iter._4_4_ - 1;
      plVar2 = ly_log_location_dnode(uVar1);
    } while (plVar2->schema == (lysc_node *)0x0);
    plVar2 = ly_log_location_dnode(uVar1);
    mod = (lys_module *)plVar2->schema;
LAB_001a7ad5:
    do {
      uVar1 = ly_log_location_dnode_count();
      schema = (lysc_node *)node;
      if (iter._4_4_ != uVar1) {
        schema = (lysc_node *)ly_log_location_dnode(iter._4_4_);
      }
      if (schema->module != (lys_module *)0x0) {
        __assert_fail("!iter->schema",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_common.c"
                      ,0xd5,
                      "const struct lysc_node *lyd_parser_node_schema(const struct lyd_node *)");
      }
      module = lyd_node_module((lyd_node *)schema);
      if (module == (lys_module *)0x0) {
        mod = (lys_module *)0x0;
        break;
      }
      if (schema->module == (lys_module *)0x0) {
        local_58 = schema->exts;
      }
      else {
        local_58 = (lysc_ext_instance *)schema->module->filepath;
      }
      mod = (lys_module *)lys_find_child((lysc_node *)mod,module,(char *)local_58,0,0,0);
      iter._4_4_ = iter._4_4_ + 1;
      local_59 = mod != (lys_module *)0x0 && schema != (lysc_node *)node;
    } while (local_59);
    node_local = (lyd_node *)mod;
  }
  else {
    node_local = (lyd_node *)node->schema;
  }
  return (lysc_node *)node_local;
}

Assistant:

const struct lysc_node *
lyd_parser_node_schema(const struct lyd_node *node)
{
    uint32_t i;
    const struct lyd_node *iter;
    const struct lysc_node *schema = NULL;
    const struct lys_module *mod;

    if (!node) {
        return NULL;
    } else if (node->schema) {
        /* simplest case */
        return node->schema;
    }

    /* find the first schema node in the parsed nodes */
    i = ly_log_location_dnode_count();
    if (i) {
        do {
            --i;
            if (ly_log_location_dnode(i)->schema) {
                /* this node is processed */
                schema = ly_log_location_dnode(i)->schema;
                ++i;
                break;
            }
        } while (i);
    }

    /* get schema node of an opaque node */
    do {
        /* get next data node */
        if (i == ly_log_location_dnode_count()) {
            iter = node;
        } else {
            iter = ly_log_location_dnode(i);
        }
        assert(!iter->schema);

        /* get module */
        mod = lyd_node_module(iter);
        if (!mod) {
            /* unknown module, no schema node */
            schema = NULL;
            break;
        }

        /* get schema node */
        schema = lys_find_child(schema, mod, LYD_NAME(iter), 0, 0, 0);

        /* move to the descendant */
        ++i;
    } while (schema && (iter != node));

    return schema;
}